

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::makeFloat16Constant(Builder *this,float f16,bool specConstant)

{
  iterator __position;
  Id typeId;
  Op OVar1;
  Id IVar2;
  _Head_base<0UL,_spv::Instruction_*,_false> this_00;
  vector<spv::Instruction*,std::allocator<spv::Instruction*>> *this_01;
  undefined7 in_register_00000031;
  uint value;
  HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
  f16Val;
  Instruction *c;
  HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
  fVal;
  FloatProxy<spvutils::Float16> local_4a;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  float local_34;
  
  typeId = makeFloatType(this,0x10);
  local_4a.data_ = 0;
  local_34 = f16;
  spvutils::
  HexFloat<spvutils::FloatProxy<float>,spvutils::HexFloatTraits<spvutils::FloatProxy<float>>>::
  castTo<spvutils::HexFloat<spvutils::FloatProxy<spvutils::Float16>,spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>>>>
            ((HexFloat<spvutils::FloatProxy<float>,spvutils::HexFloatTraits<spvutils::FloatProxy<float>>>
              *)&local_34,
             (HexFloat<spvutils::FloatProxy<spvutils::Float16>,_spvutils::HexFloatTraits<spvutils::FloatProxy<spvutils::Float16>_>_>
              *)&local_4a,kRoundToZero);
  value = (uint)local_4a.data_;
  OVar1 = OpSpecConstant;
  if (((int)CONCAT71(in_register_00000031,specConstant) != 0) ||
     (IVar2 = findScalarConstant(this,OpTypeFloat,OpConstant,typeId,value), OVar1 = OpConstant,
     IVar2 == 0)) {
    this_00._M_head_impl = (Instruction *)operator_new(0x60);
    IVar2 = this->uniqueId + 1;
    this->uniqueId = IVar2;
    (this_00._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
    (this_00._M_head_impl)->resultId = IVar2;
    (this_00._M_head_impl)->typeId = typeId;
    (this_00._M_head_impl)->opCode = OVar1;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    ((this_00._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    ((this_00._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    ((this_00._M_head_impl)->operands).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    ((this_00._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    (this_00._M_head_impl)->block = (Block *)0x0;
    local_48._M_head_impl = this_00._M_head_impl;
    Instruction::addImmediateOperand(this_00._M_head_impl,value);
    local_40._M_head_impl = this_00._M_head_impl;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Instruction[1])();
    }
    local_40._M_head_impl._0_4_ = 0x16;
    this_01 = (vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)
              std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->groupedConstants,(key_type *)&local_40);
    __position._M_current = *(Instruction ***)(this_01 + 8);
    if (__position._M_current == *(Instruction ***)(this_01 + 0x10)) {
      std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
      _M_realloc_insert<spv::Instruction*const&>(this_01,__position,&local_48._M_head_impl);
      this_00._M_head_impl = local_48._M_head_impl;
    }
    else {
      *__position._M_current = this_00._M_head_impl;
      *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
    }
    Module::mapInstruction(&this->module,this_00._M_head_impl);
    IVar2 = (local_48._M_head_impl)->resultId;
  }
  return IVar2;
}

Assistant:

Id Builder::makeFloat16Constant(float f16, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstant : OpConstant;
    Id typeId = makeFloatType(16);

    spvutils::HexFloat<spvutils::FloatProxy<float>> fVal(f16);
    spvutils::HexFloat<spvutils::FloatProxy<spvutils::Float16>> f16Val(0);
    fVal.castTo(f16Val, spvutils::kRoundToZero);

    unsigned value = f16Val.value().getAsFloat().get_value();

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (!specConstant) {
        Id existing = findScalarConstant(OpTypeFloat, opcode, typeId, value);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->addImmediateOperand(value);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeFloat].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}